

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTDMT_CCtxPool * ZSTDMT_createCCtxPool(int nbWorkers,ZSTD_customMem cMem)

{
  ZSTD_customMem customMem;
  int iVar1;
  pthread_mutex_t *__mutex;
  ZSTD_CCtx *pZVar2;
  undefined8 unaff_RBP;
  undefined8 unaff_R14;
  void *unaff_retaddr;
  
  __mutex = (pthread_mutex_t *)ZSTD_customCalloc((long)nbWorkers * 8 + 0x48,cMem);
  if (nbWorkers < 1) {
    __assert_fail("nbWorkers > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x865c,"ZSTDMT_CCtxPool *ZSTDMT_createCCtxPool(int, ZSTD_customMem)");
  }
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      *(void **)((long)__mutex + 0x40) = cMem.opaque;
      *(ZSTD_allocFunction *)((long)__mutex + 0x30) = cMem.customAlloc;
      *(ZSTD_freeFunction *)((long)__mutex + 0x38) = cMem.customFree;
      __mutex[1].__data.__lock = nbWorkers;
      *(undefined4 *)((long)__mutex + 0x2c) = 1;
      customMem.customFree = (ZSTD_freeFunction)unaff_RBP;
      customMem.customAlloc = (ZSTD_allocFunction)unaff_R14;
      customMem.opaque = unaff_retaddr;
      pZVar2 = ZSTD_createCCtx_advanced(customMem);
      *(ZSTD_CCtx **)((long)__mutex + 0x48) = pZVar2;
      if (pZVar2 != (ZSTD_CCtx *)0x0) {
        return (ZSTDMT_CCtxPool *)__mutex;
      }
      ZSTDMT_freeCCtxPool((ZSTDMT_CCtxPool *)&__mutex->__data);
    }
    else {
      ZSTD_customFree(__mutex,cMem);
    }
  }
  return (ZSTDMT_CCtxPool *)0x0;
}

Assistant:

static ZSTDMT_CCtxPool* ZSTDMT_createCCtxPool(int nbWorkers,
                                              ZSTD_customMem cMem)
{
    ZSTDMT_CCtxPool* const cctxPool = (ZSTDMT_CCtxPool*) ZSTD_customCalloc(
        sizeof(ZSTDMT_CCtxPool) + (nbWorkers-1)*sizeof(ZSTD_CCtx*), cMem);
    assert(nbWorkers > 0);
    if (!cctxPool) return NULL;
    if (ZSTD_pthread_mutex_init(&cctxPool->poolMutex, NULL)) {
        ZSTD_customFree(cctxPool, cMem);
        return NULL;
    }
    cctxPool->cMem = cMem;
    cctxPool->totalCCtx = nbWorkers;
    cctxPool->availCCtx = 1;   /* at least one cctx for single-thread mode */
    cctxPool->cctx[0] = ZSTD_createCCtx_advanced(cMem);
    if (!cctxPool->cctx[0]) { ZSTDMT_freeCCtxPool(cctxPool); return NULL; }
    DEBUGLOG(3, "cctxPool created, with %u workers", nbWorkers);
    return cctxPool;
}